

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

__m256 * __thiscall Plane::intersect(Plane *this,Ray8 *ray,DiffGeom8 *dg)

{
  uint uVar1;
  float fVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  __m256 *in_RAX;
  ulong uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  float fVar29;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar30 [32];
  undefined1 auVar37 [32];
  int iVar2;
  undefined1 auVar17 [32];
  
  uVar15._0_4_ = (this->pos).x;
  uVar15._4_4_ = (this->pos).y;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar15;
  uVar7._0_4_ = (this->normal).x;
  uVar7._4_4_ = (this->normal).y;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar7;
  auVar30._4_4_ = (undefined4)uVar15;
  auVar30._0_4_ = (undefined4)uVar15;
  auVar30._8_4_ = (undefined4)uVar15;
  auVar30._12_4_ = (undefined4)uVar15;
  auVar30._16_4_ = (undefined4)uVar15;
  auVar30._20_4_ = (undefined4)uVar15;
  auVar30._24_4_ = (undefined4)uVar15;
  auVar30._28_4_ = (undefined4)uVar15;
  auVar18 = vmovshdup_avx(auVar18);
  auVar19._0_8_ = auVar18._0_8_;
  auVar19._8_8_ = auVar19._0_8_;
  auVar19._16_8_ = auVar19._0_8_;
  auVar19._24_8_ = auVar19._0_8_;
  fVar3 = (this->pos).z;
  auVar37._4_4_ = fVar3;
  auVar37._0_4_ = fVar3;
  auVar37._8_4_ = fVar3;
  auVar37._12_4_ = fVar3;
  auVar37._16_4_ = fVar3;
  auVar37._20_4_ = fVar3;
  auVar37._24_4_ = fVar3;
  auVar37._28_4_ = fVar3;
  auVar25._4_4_ = (undefined4)uVar7;
  auVar25._0_4_ = (undefined4)uVar7;
  auVar25._8_4_ = (undefined4)uVar7;
  auVar25._12_4_ = (undefined4)uVar7;
  auVar25._16_4_ = (undefined4)uVar7;
  auVar25._20_4_ = (undefined4)uVar7;
  auVar25._24_4_ = (undefined4)uVar7;
  auVar25._28_4_ = (undefined4)uVar7;
  auVar18 = vmovshdup_avx(auVar21);
  uVar20 = auVar18._0_8_;
  auVar23._8_8_ = uVar20;
  auVar23._0_8_ = uVar20;
  auVar23._16_8_ = uVar20;
  auVar23._24_8_ = uVar20;
  fVar3 = (this->normal).z;
  auVar22._4_4_ = fVar3;
  auVar22._0_4_ = fVar3;
  auVar22._8_4_ = fVar3;
  auVar22._12_4_ = fVar3;
  auVar22._16_4_ = fVar3;
  auVar22._20_4_ = fVar3;
  auVar22._24_4_ = fVar3;
  auVar22._28_4_ = fVar3;
  auVar24 = *(undefined1 (*) [32])(ray->o).x;
  auVar4 = *(undefined1 (*) [32])(ray->o).y;
  auVar5 = *(undefined1 (*) [32])(ray->o).z;
  fVar3 = (ray->d).x[0];
  fVar8 = (ray->d).x[1];
  fVar9 = (ray->d).x[2];
  fVar10 = (ray->d).x[3];
  fVar11 = (ray->d).x[4];
  fVar12 = (ray->d).x[5];
  fVar13 = (ray->d).x[6];
  fVar14 = (ray->d).x[7];
  auVar6 = vsubps_avx(auVar30,auVar24);
  auVar19 = vsubps_avx(auVar19,auVar4);
  auVar17 = vsubps_avx(auVar37,auVar5);
  auVar16._4_4_ = auVar6._4_4_ * (float)(undefined4)uVar7;
  auVar16._0_4_ = auVar6._0_4_ * (float)(undefined4)uVar7;
  auVar16._8_4_ = auVar6._8_4_ * (float)(undefined4)uVar7;
  auVar16._12_4_ = auVar6._12_4_ * (float)(undefined4)uVar7;
  auVar16._16_4_ = auVar6._16_4_ * (float)(undefined4)uVar7;
  auVar16._20_4_ = auVar6._20_4_ * (float)(undefined4)uVar7;
  auVar16._24_4_ = auVar6._24_4_ * (float)(undefined4)uVar7;
  auVar16._28_4_ = auVar6._28_4_;
  auVar18 = vfmadd231ps_fma(auVar16,auVar23,auVar19);
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar22,auVar17);
  auVar6._4_4_ = (float)(undefined4)uVar7 * fVar8;
  auVar6._0_4_ = (float)(undefined4)uVar7 * fVar3;
  auVar6._8_4_ = (float)(undefined4)uVar7 * fVar9;
  auVar6._12_4_ = (float)(undefined4)uVar7 * fVar10;
  auVar6._16_4_ = (float)(undefined4)uVar7 * fVar11;
  auVar6._20_4_ = (float)(undefined4)uVar7 * fVar12;
  auVar6._24_4_ = (float)(undefined4)uVar7 * fVar13;
  auVar6._28_4_ = auVar19._28_4_;
  auVar21 = vfmadd231ps_fma(auVar6,auVar23,*(undefined1 (*) [32])(ray->d).y);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar22,*(undefined1 (*) [32])(ray->d).z);
  auVar19 = vdivps_avx(ZEXT1632(auVar18),ZEXT1632(auVar21));
  auVar6 = *(undefined1 (*) [32])ray->t_max;
  uVar15 = vcmpps_avx512vl(auVar19,auVar6,1);
  uVar7 = vcmpps_avx512vl(auVar19,*(undefined1 (*) [32])ray->t_min,0xe);
  uVar15 = uVar15 & uVar7;
  auVar16 = vmovdqa32_avx512vl(*(undefined1 (*) [32])ray->active);
  auVar17._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar16._4_4_;
  auVar17._0_4_ = (uint)((byte)uVar15 & 1) * auVar16._0_4_;
  auVar17._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar16._8_4_;
  auVar17._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar16._12_4_;
  auVar17._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar16._16_4_;
  uVar1 = (uint)((byte)(uVar15 >> 5) & 1) * auVar16._20_4_;
  auVar17._20_4_ = uVar1;
  auVar17._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar16._24_4_;
  iVar2 = (uint)(byte)(uVar15 >> 7) * auVar16._28_4_;
  auVar17._28_4_ = iVar2;
  if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0x7f,0) != '\0') || (uVar1 & 1) != 0) ||
       SUB321(auVar17 >> 0xbf,0) != '\0') ||
      (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || iVar2 < 0) {
    auVar19 = vblendvps_avx(auVar6,auVar19,auVar17);
    *(undefined1 (*) [32])ray->t_max = auVar19;
    fVar29 = auVar19._0_4_;
    fVar31 = auVar19._4_4_;
    fVar32 = auVar19._8_4_;
    fVar33 = auVar19._12_4_;
    fVar34 = auVar19._16_4_;
    fVar35 = auVar19._20_4_;
    fVar36 = auVar19._24_4_;
    auVar26._0_4_ = auVar24._0_4_ + fVar29 * fVar3;
    auVar26._4_4_ = auVar24._4_4_ + fVar31 * fVar8;
    auVar26._8_4_ = auVar24._8_4_ + fVar32 * fVar9;
    auVar26._12_4_ = auVar24._12_4_ + fVar33 * fVar10;
    auVar26._16_4_ = auVar24._16_4_ + fVar34 * fVar11;
    auVar26._20_4_ = auVar24._20_4_ + fVar35 * fVar12;
    auVar26._24_4_ = auVar24._24_4_ + fVar36 * fVar13;
    auVar26._28_4_ = auVar24._28_4_ + fVar14;
    auVar27._0_4_ = fVar29 * (ray->d).y[0] + auVar4._0_4_;
    auVar27._4_4_ = fVar31 * (ray->d).y[1] + auVar4._4_4_;
    auVar27._8_4_ = fVar32 * (ray->d).y[2] + auVar4._8_4_;
    auVar27._12_4_ = fVar33 * (ray->d).y[3] + auVar4._12_4_;
    auVar27._16_4_ = fVar34 * (ray->d).y[4] + auVar4._16_4_;
    auVar27._20_4_ = fVar35 * (ray->d).y[5] + auVar4._20_4_;
    auVar27._24_4_ = fVar36 * (ray->d).y[6] + auVar4._24_4_;
    auVar27._28_4_ = auVar6._28_4_ + auVar4._28_4_;
    auVar28._0_4_ = fVar29 * (ray->d).z[0] + auVar5._0_4_;
    auVar28._4_4_ = fVar31 * (ray->d).z[1] + auVar5._4_4_;
    auVar28._8_4_ = fVar32 * (ray->d).z[2] + auVar5._8_4_;
    auVar28._12_4_ = fVar33 * (ray->d).z[3] + auVar5._12_4_;
    auVar28._16_4_ = fVar34 * (ray->d).z[4] + auVar5._16_4_;
    auVar28._20_4_ = fVar35 * (ray->d).z[5] + auVar5._20_4_;
    auVar28._24_4_ = fVar36 * (ray->d).z[6] + auVar5._24_4_;
    auVar28._28_4_ = auVar19._28_4_ + auVar5._28_4_;
    auVar24 = *(undefined1 (*) [32])(dg->normal).x;
    auVar4 = vblendvps_avx(*(undefined1 (*) [32])(dg->point).x,auVar26,auVar17);
    *(undefined1 (*) [32])(dg->point).x = auVar4;
    auVar4 = vblendvps_avx(*(undefined1 (*) [32])(dg->point).y,auVar27,auVar17);
    *(undefined1 (*) [32])(dg->point).y = auVar4;
    auVar4 = vblendvps_avx(*(undefined1 (*) [32])(dg->point).z,auVar28,auVar17);
    *(undefined1 (*) [32])(dg->point).z = auVar4;
    auVar24 = vblendvps_avx(auVar24,auVar25,auVar17);
    *(undefined1 (*) [32])(dg->normal).x = auVar24;
    auVar24 = vblendvps_avx(*(undefined1 (*) [32])(dg->normal).y,auVar23,auVar17);
    *(undefined1 (*) [32])(dg->normal).y = auVar24;
    auVar24 = vblendvps_avx(*(undefined1 (*) [32])(dg->normal).z,auVar22,auVar17);
    *(undefined1 (*) [32])(dg->normal).z = auVar24;
    iVar2 = this->material_id;
    auVar24._4_4_ = iVar2;
    auVar24._0_4_ = iVar2;
    auVar24._8_4_ = iVar2;
    auVar24._12_4_ = iVar2;
    auVar24._16_4_ = iVar2;
    auVar24._20_4_ = iVar2;
    auVar24._24_4_ = iVar2;
    auVar24._28_4_ = iVar2;
    auVar24 = vblendvps_avx(*(undefined1 (*) [32])dg->material_id,auVar24,auVar17);
    *(undefined1 (*) [32])dg->material_id = auVar24;
  }
  return in_RAX;
}

Assistant:

inline Vec3f_8(Vec3f v)
		: x(_mm256_set1_ps(v.x)), y(_mm256_set1_ps(v.y)), z(_mm256_set1_ps(v.z)){}